

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O2

void __thiscall
HawkTracer::client::CallgrindConverter::process_event(CallgrindConverter *this,Event *event)

{
  bool bVar1;
  uint uVar2;
  unsigned_long uVar3;
  vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
  *this_00;
  HT_ThreadId thread_id;
  HT_DurationNs duration;
  HT_TimestampNs start_ts;
  string label;
  allocator local_7d;
  uint local_7c;
  unsigned_long local_78;
  ulong local_70;
  string local_68;
  unsigned_long local_48;
  string local_40;
  
  Converter::_get_label_abi_cxx11_(&local_40,&this->super_Converter,event);
  bVar1 = std::operator==(&local_40,"");
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_68,"thread_id",(allocator *)&local_78);
    local_70 = local_70 & 0xffffffff00000000;
    uVar2 = parser::Event::get_value_or_default<unsigned_int>(event,&local_68,(uint *)&local_70);
    std::__cxx11::string::~string((string *)&local_68);
    local_70 = *(ulong *)(event + 0x48);
    local_7c = uVar2;
    std::__cxx11::string::string((string *)&local_68,"duration",&local_7d);
    local_48 = 0;
    uVar3 = parser::Event::get_value_or_default<unsigned_long>(event,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    local_78 = uVar3;
    this_00 = (vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
               *)std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->_events,&local_7c);
    std::
    vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
    ::emplace_back<std::__cxx11::string&,unsigned_long&,unsigned_long&>
              (this_00,&local_40,&local_70,&local_78);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void CallgrindConverter::process_event(const parser::Event& event)
{
    std::string label = _get_label(event);

    if (label == "")
    {
        return;
    }
    HT_ThreadId thread_id = event.get_value_or_default<HT_ThreadId>("thread_id", 0u);
    HT_TimestampNs start_ts = event.get_timestamp();
    HT_DurationNs duration = event.get_value_or_default<HT_DurationNs>("duration", 0u);
    _events[thread_id].emplace_back(label, start_ts, duration);
}